

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_openssl.cpp
# Opt level: O0

void __thiscall QDtlsPrivateOpenSSL::storePeerCertificates(QDtlsPrivateOpenSSL *this)

{
  bool bVar1;
  ulong uVar2;
  stack_st_X509 *in_RDI;
  long in_FS_OFFSET;
  stack_st_X509 *stack;
  X509 *x509;
  QList<QSslCertificate> peerCertificateChain;
  QSslCertificate peerCertificate;
  SSL *in_stack_ffffffffffffff98;
  stack_st_X509 *x509_00;
  X509 *in_stack_ffffffffffffffd8;
  QSslCertificate local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  x509_00 = in_RDI;
  QSharedPointer<ssl_st>::data((QSharedPointer<ssl_st> *)0x17e0d5);
  q_SSL_get1_peer_certificate(in_stack_ffffffffffffff98);
  local_10.d.d.ptr =
       (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
       (totally_ordered_wrapper<QSslCertificatePrivate_*>)0xaaaaaaaaaaaaaaaa;
  QTlsPrivate::X509CertificateOpenSSL::certificateFromX509(in_stack_ffffffffffffffd8);
  QTlsBackend::storePeerCertificate
            ((QSslConfiguration *)(in_RDI + 0x38),(QSslCertificate *)&local_10);
  q_X509_free((X509 *)0x17e11e);
  QSslConfiguration::peerCertificateChain();
  bVar1 = QList<QSslCertificate>::isEmpty((QList<QSslCertificate> *)0x17e163);
  if (bVar1) {
    QSharedPointer<ssl_st>::data((QSharedPointer<ssl_st> *)0x17e181);
    q_SSL_get_peer_cert_chain(in_stack_ffffffffffffff98);
    QTlsPrivate::X509CertificateOpenSSL::stackOfX509ToQSslCertificates(x509_00);
    QList<QSslCertificate>::operator=
              ((QList<QSslCertificate> *)in_RDI,(QList<QSslCertificate> *)in_stack_ffffffffffffff98)
    ;
    QList<QSslCertificate>::~QList((QList<QSslCertificate> *)0x17e1b6);
    uVar2 = QSslCertificate::isNull();
    if (((uVar2 & 1) == 0) && (*(int *)(in_RDI + 0x40) == 2)) {
      QList<QSslCertificate>::prepend
                ((QList<QSslCertificate> *)in_RDI,(parameter_type)in_stack_ffffffffffffff98);
    }
    QTlsBackend::storePeerCertificateChain
              ((QSslConfiguration *)(in_RDI + 0x38),(QList_conflict1 *)&stack0xffffffffffffffd8);
  }
  QList<QSslCertificate>::~QList((QList<QSslCertificate> *)0x17e1ff);
  QSslCertificate::~QSslCertificate(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDtlsPrivateOpenSSL::storePeerCertificates()
{
    Q_ASSERT(dtls.tlsConnection.data());
    // Store the peer certificate and chain. For clients, the peer certificate
    // chain includes the peer certificate; for servers, it doesn't. Both the
    // peer certificate and the chain may be empty if the peer didn't present
    // any certificate.
    X509 *x509 = q_SSL_get_peer_certificate(dtls.tlsConnection.data());
    const auto peerCertificate = QTlsPrivate::X509CertificateOpenSSL::certificateFromX509(x509);
    QTlsBackend::storePeerCertificate(dtlsConfiguration, peerCertificate);
    q_X509_free(x509);

    auto peerCertificateChain = dtlsConfiguration.peerCertificateChain();
    if (peerCertificateChain.isEmpty()) {
        auto stack = q_SSL_get_peer_cert_chain(dtls.tlsConnection.data());
        peerCertificateChain = QTlsPrivate::X509CertificateOpenSSL::stackOfX509ToQSslCertificates(stack);
        if (!peerCertificate.isNull() && mode == QSslSocket::SslServerMode)
            peerCertificateChain.prepend(peerCertificate);
        QTlsBackend::storePeerCertificateChain(dtlsConfiguration, peerCertificateChain);
    }
}